

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O1

compile_errcode __thiscall ReturnStatement::Parse(ReturnStatement *this)

{
  bool bVar1;
  LogTools *pLVar2;
  Expression *this_00;
  int iVar3;
  SymbolName SVar4;
  compile_errcode cVar5;
  int iVar6;
  compile_errcode unaff_R14D;
  string local_58;
  Expression *local_38;
  
  local_38 = &this->m_expression;
  iVar6 = 0;
  do {
    SVar4 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    this_00 = local_38;
    pLVar2 = g_log_tools;
    iVar3 = iVar6;
    switch(iVar6) {
    case 0:
      iVar3 = 1;
      if (SVar4 == RETURN_SYM) break;
      unaff_R14D = -1;
      iVar6 = 0;
      goto LAB_0012b73b;
    case 1:
      iVar6 = 1;
      if (SVar4 == SEMICOLON_SYM) goto switchD_0012b5ed_caseD_4;
      iVar3 = 2;
      if (SVar4 != L_CIRCLE_BRACKET_SYM) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"expected a \'(\' or \';\'","");
        GrammaErrorLogs(pLVar2,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        unaff_R14D = -1;
        goto LAB_0012b73b;
      }
      break;
    case 2:
      cVar5 = Expression::Parse(local_38);
      pLVar2 = g_log_tools;
      if (cVar5 != 0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"expected a valid expression in return statement","");
        GrammaErrorLogs(pLVar2,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        unaff_R14D = -1;
        iVar6 = 2;
        goto LAB_0012b73b;
      }
      Expression::LogOutput(this_00);
      iVar3 = 3;
      break;
    case 3:
      iVar3 = 4;
      if (SVar4 != R_CIRCLE_BRACKET_SYM) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"expected a \')\'","");
        GrammaErrorLogs(pLVar2,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        unaff_R14D = -1;
        iVar6 = 3;
        goto LAB_0012b73b;
      }
      break;
    case 4:
switchD_0012b5ed_caseD_4:
      unaff_R14D = 0;
LAB_0012b73b:
      bVar1 = false;
      goto LAB_0012b768;
    }
    iVar6 = iVar3;
    bVar1 = true;
    if (iVar6 != 3) {
      SymbolQueue::NextSymbol(handle_symbol_queue);
    }
LAB_0012b768:
    if (!bVar1) {
      return unaff_R14D;
    }
  } while( true );
}

Assistant:

compile_errcode ReturnStatement::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == RETURN_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    return COMPILE_OK;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a '(' or ';'");
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_expression.Parse()) == COMPILE_OK) {
                    state = 3;
                    m_expression.LogOutput();
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid expression in return statement");
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')'");
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_symbol_queue->NextSymbol();
    }
}